

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O2

int Saig_StrSimIsEqual(Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (lVar3 == 0x10) {
      return 1;
    }
    lVar1 = lVar3 * 4;
    lVar2 = lVar3 * 4;
    lVar3 = lVar3 + 1;
  } while (*(int *)((long)(pObj0->field_5).pData + lVar1) ==
           *(int *)((long)(pObj1->field_5).pData + lVar2));
  return 0;
}

Assistant:

int Saig_StrSimIsEqual( Aig_Obj_t * pObj0, Aig_Obj_t * pObj1 )
{
    unsigned * pSims0 = (unsigned *)pObj0->pData;
    unsigned * pSims1 = (unsigned *)pObj1->pData;
    int i;
    for ( i = 0; i < SAIG_WORDS; i++ )
        if ( pSims0[i] != pSims1[i] )
            return 0;
    return 1;
}